

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

string * __thiscall
units::probeUnitBase_abi_cxx11_
          (string *__return_storage_ptr__,units *this,precise_unit *un,
          pair<units::precise_unit,_const_char_*> *probe)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  pointer pcVar4;
  pointer pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  double dVar7;
  bool bVar8;
  unit_data uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 numOnly;
  bool numOnly_00;
  byte *pbVar14;
  undefined8 uVar15;
  precise_unit pVar16;
  string prefix;
  __string_type __str;
  unit base;
  string beststr;
  string fnd;
  size_t cut;
  unit in_stack_fffffffffffffe48;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  double local_170;
  undefined8 local_168;
  double local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  size_t local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar2 = &local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_170 = *(double *)this;
  local_160 = un->multiplier_;
  local_158._M_dataplus._M_p = (pointer)paVar2;
  uVar9 = detail::unit_data::operator*((unit_data *)(this + 8),&un->base_units_);
  local_168 = CONCAT44(uVar9,0x3f800000);
  find_unit_abi_cxx11_(in_stack_fffffffffffffe48);
  local_170 = local_170 * local_160;
  if (local_118._8_8_ != 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_118._0_8_,(pointer)(local_118._0_8_ + local_118._8_8_));
    generateUnitSequence(&local_1b0,local_170,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_1b0._M_dataplus._M_p,
               local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_replace_aux(&local_190,local_190._M_string_length,0,1,'/');
    pbVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_190,(char *)un[1].multiplier_);
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    pcVar4 = (pbVar10->_M_dataplus)._M_p;
    paVar12 = &pbVar10->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar12) {
      uVar15 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      paVar1->_M_allocated_capacity = paVar12->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar15;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    pbVar14 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
    bVar3 = *pbVar14;
    if (((byte)(bVar3 - 0x30) < 10) ||
       ((bVar3 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar3 & 0x3f) & 1) != 0)))) {
      if ((local_158._M_string_length == 0) ||
         (__return_storage_ptr__->_M_string_length < local_158._M_string_length)) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&local_158,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__);
        pbVar14 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pbVar14 != paVar1) {
        operator_delete(pbVar14,paVar1->_M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_003fae2a;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) goto LAB_003fafc5;
LAB_003fadcd:
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    goto LAB_003fafc5;
  }
LAB_003fae2a:
  local_160 = (double)CONCAT44(local_160._4_4_,(undefined4)local_168);
  detail::unit_data::inv((unit_data *)((long)&local_168 + 4));
  find_unit_abi_cxx11_(in_stack_fffffffffffffe48);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0);
  numOnly = extraout_DL;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    numOnly = extraout_DL_00;
  }
  if (local_118._8_8_ != 0) {
    getMultiplierString_abi_cxx11_
              (&local_1b0,
               (units *)(ulong)((byte)(*(char *)(local_118._0_8_ + (local_118._8_8_ - 1)) - 0x30U) <
                               10),1.0 / local_170,(bool)numOnly);
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"1/(","");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,(char *)local_118._0_8_,local_118._8_8_);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,'*');
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,(char *)un[1].multiplier_);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,')');
    if (local_1b0._M_string_length == 0) {
      bVar8 = false;
    }
    else {
      bVar3 = *local_1b0._M_dataplus._M_p;
      if (9 < (byte)(bVar3 - 0x30)) {
        bVar8 = false;
        if ((0x2e < bVar3) ||
           (bVar8 = false, (0x680000000000U >> ((ulong)(uint)bVar3 & 0x3f) & 1) == 0))
        goto LAB_003fafa4;
      }
      if ((local_158._M_string_length == 0) ||
         (__return_storage_ptr__->_M_string_length < local_158._M_string_length)) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(&local_158,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__);
      }
      pcVar5 = (__return_storage_ptr__->_M_dataplus)._M_p;
      bVar8 = true;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != paVar1) {
        operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
      }
    }
LAB_003fafa4:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar8) goto LAB_003fafc5;
  }
  pVar16 = precise_unit::operator/((precise_unit *)this,un);
  local_170 = pVar16.multiplier_;
  local_168 = pVar16._8_8_ << 0x20 | 0x3f800000;
  find_unit_abi_cxx11_(in_stack_fffffffffffffe48);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_118._8_8_ != 0) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_118._0_8_,(pointer)(local_118._0_8_ + local_118._8_8_));
    generateUnitSequence(&local_1b0,local_170,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_1b0._M_dataplus._M_p,
               local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_replace_aux(&local_190,local_190._M_string_length,0,1,'*');
    pbVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_190,(char *)un[1].multiplier_);
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
    pcVar4 = (pbVar10->_M_dataplus)._M_p;
    paVar12 = &pbVar10->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar12) {
      uVar15 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      paVar1->_M_allocated_capacity = paVar12->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar15;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    pbVar14 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
    bVar3 = *pbVar14;
    if ((9 < (byte)(bVar3 - 0x30)) &&
       ((0x2e < bVar3 || ((0x680000000000U >> ((ulong)(uint)bVar3 & 0x3f) & 1) == 0)))) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p == &local_1b0.field_2) goto LAB_003fafc5;
      goto LAB_003fadcd;
    }
    if ((local_158._M_string_length == 0) ||
       (__return_storage_ptr__->_M_string_length < local_158._M_string_length)) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(&local_158,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__);
      pbVar14 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pbVar14 != paVar1) {
      operator_delete(pbVar14,paVar1->_M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
  }
  local_160 = (double)CONCAT44(local_160._4_4_,(undefined4)local_168);
  detail::unit_data::inv((unit_data *)((long)&local_168 + 4));
  find_unit_abi_cxx11_(in_stack_fffffffffffffe48);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_118._8_8_ != 0) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_118._0_8_,(pointer)(local_118._0_8_ + local_118._8_8_));
    generateUnitSequence(&local_1b0,1.0 / local_170,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = *local_1b0._M_dataplus._M_p;
    if (((byte)(bVar3 - 0x30) < 10) ||
       ((bVar3 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar3 & 0x3f) & 1) != 0)))) {
      local_b8 = 0;
      dVar7 = getDoubleFromString(&local_1b0,&local_b8);
      getMultiplierString_abi_cxx11_(&local_50,(units *)0x1,1.0 / dVar7,numOnly_00);
      pbVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_50,(char *)un[1].multiplier_);
      local_d8._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
      paVar12 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p == paVar12) {
        local_d8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_d8._M_string_length = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      pbVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::append(&local_d8,"/");
      paVar12 = &local_138.field_2;
      local_138._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
      paVar13 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == paVar13) {
        local_138.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_138._M_dataplus._M_p = (pointer)paVar12;
      }
      else {
        local_138.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_138._M_string_length = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                 local_b8,0xffffffffffffffff);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar12) {
        uVar15 = local_138.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_f8._8_8_ + local_138._M_string_length) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_allocated_capacity != &local_e8) {
          uVar15 = local_e8._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_f8._8_8_ + local_138._M_string_length) goto LAB_003fb490;
        pbVar10 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_f8,0,0,local_138._M_dataplus._M_p,local_138._M_string_length);
      }
      else {
LAB_003fb490:
        pbVar10 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                            (&local_138,(char *)local_f8._M_allocated_capacity,local_f8._8_8_);
      }
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar10->_M_dataplus)._M_p;
      paVar13 = &pbVar10->field_2;
      if (paVar6 == paVar13) {
        local_190.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_190.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      }
      else {
        local_190.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_190._M_dataplus._M_p = (pointer)paVar6;
      }
      local_190._M_string_length = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar10->_M_string_length = 0;
      paVar13->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_allocated_capacity != &local_e8) {
        operator_delete((void *)local_f8._M_allocated_capacity,local_e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar12) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_190._M_string_length <= local_158._M_string_length - 1) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign(&local_158,&local_190);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      bVar8 = true;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,(char *)un[1].multiplier_,(allocator<char> *)&local_d8);
      pbVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::append(&local_138,"/");
      local_190._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
      paVar12 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p == paVar12) {
        local_190.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_190.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      }
      else {
        local_190.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      local_190._M_string_length = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      pbVar10 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::_M_append(&local_190,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = (pbVar10->_M_dataplus)._M_p;
      paVar12 = &pbVar10->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 == paVar12) {
        uVar15 = *(undefined8 *)((long)&pbVar10->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar15;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar12->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = pbVar10->_M_string_length;
      (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      bVar8 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    }
    if (!bVar8) goto LAB_003fafc5;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p == paVar2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,local_158.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_158.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_158._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,local_158.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_158._M_string_length;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_158._M_dataplus._M_p = (pointer)paVar2;
LAB_003fafc5:
  psVar11 = (string *)(local_118 + 0x10);
  if ((string *)local_118._0_8_ != psVar11) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
    psVar11 = extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
    psVar11 = extraout_RAX_00;
  }
  return psVar11;
}

Assistant:

static std::string probeUnitBase(
    const precise_unit& un,
    const std::pair<precise_unit, const char*>& probe)
{
    std::string beststr;
    // let's try common divisor units on base units
    auto ext = un * probe.first;
    auto base = unit(ext.base_units());
    auto fnd = find_unit(base);
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(ext.multiplier(), fnd);

        auto str = prefix + '/' + probe.second;
        if (!isNumericalStartCharacter(str.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = str;
        }
    }
    // let's try inverse of common multiplier units on base units
    fnd = find_unit(base.inv());
    if (!fnd.empty()) {
        auto prefix = getMultiplierString(
            1.0 / ext.multiplier(), isDigitCharacter(fnd.back()));
        std::string str{"1/("};
        str += prefix;
        str += fnd;
        str.push_back('*');
        str.append(probe.second);
        str.push_back(')');
        if (prefix.empty() || !isNumericalStartCharacter(prefix.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = std::move(str);
        }
    }
    // let's try common multiplier units on base units
    ext = un / probe.first;
    base = unit(ext.base_units());
    fnd = find_unit(base);
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(ext.multiplier(), fnd);
        auto str = prefix + '*' + probe.second;
        if (!isNumericalStartCharacter(str.front())) {
            return str;
        }
        if (beststr.empty() || str.size() < beststr.size()) {
            beststr = str;
        }
    }
    // let's try common divisor with inv units on base units
    fnd = find_unit(base.inv());
    if (!fnd.empty()) {
        auto prefix = generateUnitSequence(1.0 / ext.multiplier(), fnd);
        if (isNumericalStartCharacter(prefix.front())) {
            size_t cut{0};
            double mx = getDoubleFromString(prefix, &cut);

            auto str = getMultiplierString(1.0 / mx, true) + probe.second +
                "/" + prefix.substr(cut);
            if (beststr.empty() || str.size() < beststr.size()) {
                beststr = str;
            }

        } else {
            return std::string(probe.second) + "/" + prefix;
        }
    }
    return beststr;
}